

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void execute(Grasp *grasp,seconds timeout)

{
  undefined1 local_b0 [8];
  unique_lock<std::mutex> l;
  type local_90;
  thread local_78;
  thread t;
  condition_variable cv;
  undefined1 local_40 [8];
  mutex m;
  Grasp *grasp_local;
  seconds timeout_local;
  
  m.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)grasp;
  grasp_local = (Grasp *)timeout.__r;
  std::mutex::mutex((mutex *)local_40);
  std::condition_variable::condition_variable((condition_variable *)&t);
  local_90.grasp = (Grasp **)((long)&m.super___mutex_base._M_mutex + 0x20);
  local_90.m = (mutex *)local_40;
  local_90.cv = (condition_variable *)&t;
  std::thread::thread<execute(Grasp*,std::chrono::duration<long,std::ratio<1l,1l>>)::__0,,void>
            (&local_78,&local_90);
  std::thread::detach();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_b0,(mutex_type *)local_40);
  std::condition_variable::wait_for<long,std::ratio<1l,1l>>
            ((condition_variable *)&t,(unique_lock<std::mutex> *)local_b0,
             (duration<long,_std::ratio<1L,_1L>_> *)&grasp_local);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
  std::thread::~thread(&local_78);
  std::condition_variable::~condition_variable((condition_variable *)&t);
  return;
}

Assistant:

void execute(Grasp *grasp, chrono::seconds timeout) {
    mutex m;
    condition_variable cv;

    thread t([&m, &cv, &grasp]()
             {
                 grasp->run(true);
                 cv.notify_one();
             });

    t.detach();

    unique_lock<mutex> l(m);
    cv.wait_for(l, timeout);
}